

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1.c
# Opt level: O3

size_t ptls_asn1_validation_recursive
                 (uint8_t *bytes,size_t bytes_max,int *decode_error,int level,
                 ptls_minicrypto_log_ctx_t *log_ctx)

{
  int *piVar1;
  size_t sVar2;
  ulong byte_index;
  size_t sVar3;
  ulong uVar4;
  int iVar5;
  uint8_t *puVar6;
  int indefinite_length;
  size_t local_68;
  uint8_t *local_60;
  int local_58;
  uint32_t type_number;
  int type_class;
  int structure_bit;
  int *local_48;
  size_t last_byte;
  uint32_t local_34;
  
  structure_bit = 0;
  type_class = 0;
  type_number = 0;
  indefinite_length = 0;
  last_byte = 0;
  local_68 = bytes_max;
  sVar2 = ptls_asn1_read_type(bytes,bytes_max,&structure_bit,&type_class,&type_number,decode_error,
                              level,log_ctx);
  if ((log_ctx != (ptls_minicrypto_log_ctx_t *)0x0) && (*decode_error == 0)) {
    ptls_asn1_print_type(type_class,type_number,level,log_ctx);
  }
  sVar3 = local_68;
  local_60 = bytes;
  byte_index = ptls_asn1_read_length
                         (bytes,local_68,sVar2,&local_34,&indefinite_length,&last_byte,decode_error,
                          level,log_ctx);
  sVar2 = last_byte;
  puVar6 = local_60;
  if (last_byte <= sVar3) {
    if (structure_bit == 0) {
      ptls_asn1_dump_content(local_60,last_byte,byte_index,log_ctx);
      byte_index = sVar2;
    }
    else {
      if (log_ctx != (ptls_minicrypto_log_ctx_t *)0x0) {
        (*log_ctx->fn)(log_ctx->ctx," {\n");
      }
      uVar4 = byte_index;
      if (byte_index < sVar2) {
        local_58 = indefinite_length;
        iVar5 = level + 1;
        local_48 = decode_error;
LAB_00110e53:
        piVar1 = local_48;
        sVar3 = local_68;
        if ((local_58 == 0) || (puVar6[byte_index] != '\0')) {
          sVar3 = ptls_asn1_validation_recursive
                            (puVar6 + byte_index,sVar2 - byte_index,local_48,iVar5,log_ctx);
          uVar4 = local_68;
          if (*piVar1 == 0) goto code_r0x00110e91;
        }
        else {
          uVar4 = byte_index + 2;
          if ((uVar4 <= local_68) && (puVar6[byte_index + 1] == '\0')) {
            if (log_ctx == (ptls_minicrypto_log_ctx_t *)0x0) {
              return uVar4;
            }
            if (-1 < level) {
              do {
                (*log_ctx->fn)(log_ctx->ctx,"   ");
                iVar5 = iVar5 + -1;
              } while (iVar5 != 0);
            }
            (*log_ctx->fn)(log_ctx->ctx,"EOC\n");
            goto LAB_00110f3e;
          }
          ptls_asn1_error_message
                    ("EOC: unexpected end of content",local_68,byte_index,iVar5,log_ctx);
          *local_48 = 0x239;
          uVar4 = sVar3;
        }
      }
LAB_00110f36:
      byte_index = uVar4;
      if (log_ctx != (ptls_minicrypto_log_ctx_t *)0x0) {
LAB_00110f3e:
        if (-1 < level) {
          iVar5 = level + 1;
          do {
            (*log_ctx->fn)(log_ctx->ctx,"   ");
            iVar5 = iVar5 + -1;
          } while (iVar5 != 0);
        }
        (*log_ctx->fn)(log_ctx->ctx,"}");
        byte_index = uVar4;
      }
    }
  }
  return byte_index;
code_r0x00110e91:
  byte_index = byte_index + sVar3;
  if (log_ctx != (ptls_minicrypto_log_ctx_t *)0x0) {
    if (byte_index < sVar2) {
      (*log_ctx->fn)(log_ctx->ctx,",");
    }
    (*log_ctx->fn)(log_ctx->ctx,"\n");
  }
  uVar4 = byte_index;
  puVar6 = local_60;
  if (sVar2 <= byte_index) goto LAB_00110f36;
  goto LAB_00110e53;
}

Assistant:

size_t ptls_asn1_validation_recursive(const uint8_t *bytes, size_t bytes_max, int *decode_error, int level,
                                      ptls_minicrypto_log_ctx_t *log_ctx)
{
    /* Get the type byte */
    int structure_bit = 0;
    int type_class = 0;
    uint32_t type_number = 0;
    uint32_t length = 0;
    int indefinite_length = 0;
    size_t last_byte = 0;
    /* Decode the type */
    size_t byte_index =
        ptls_asn1_read_type(bytes, bytes_max, &structure_bit, &type_class, &type_number, decode_error, level, log_ctx);

    if (*decode_error == 0 && log_ctx != NULL) {
        ptls_asn1_print_type(type_class, type_number, level, log_ctx);
    }

    /* Get the length */
    byte_index =
        ptls_asn1_read_length(bytes, bytes_max, byte_index, &length, &indefinite_length, &last_byte, decode_error, level, log_ctx);

    if (last_byte <= bytes_max) {
        if (structure_bit) {
            /* If structured, recurse on a loop */
            if (log_ctx != NULL) {
                log_ctx->fn(log_ctx->ctx, " {\n");
            }

            while (byte_index < last_byte) {
                if (indefinite_length != 0 && bytes[byte_index] == 0) {
                    if (byte_index + 2 > bytes_max || bytes[byte_index + 1] != 0) {
                        byte_index =
                            ptls_asn1_error_message("EOC: unexpected end of content", bytes_max, byte_index, level + 1, log_ctx);

                        *decode_error = PTLS_ERROR_BER_UNEXPECTED_EOC;
                        byte_index = bytes_max;
                        break;
                    } else {
                        if (log_ctx != NULL) {
                            ptls_asn1_print_indent(level, log_ctx);
                            log_ctx->fn(log_ctx->ctx, "EOC\n");
                        }
                        byte_index += 2;
                        break;
                    }
                } else {
                    byte_index += ptls_asn1_validation_recursive(bytes + byte_index, last_byte - byte_index, decode_error,
                                                                 level + 1, log_ctx);

                    if (*decode_error) {
                        byte_index = bytes_max;
                        break;
                    }
                }

                if (log_ctx != NULL) {
                    if (byte_index < last_byte) {
                        log_ctx->fn(log_ctx->ctx, ",");
                    }
                    log_ctx->fn(log_ctx->ctx, "\n");
                }
            }

            if (log_ctx != NULL) {
                ptls_asn1_print_indent(level, log_ctx);
                log_ctx->fn(log_ctx->ctx, "}");
            }
        } else {
            ptls_asn1_dump_content(bytes, last_byte, byte_index, log_ctx);
            byte_index = last_byte;
        }
    }

    return byte_index;
}